

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O0

DdNode * Cudd_bddVectorCompose(DdManager *dd,DdNode *f,DdNode **vector)

{
  DdHashTable *table_00;
  DdNode *pDVar1;
  int local_3c;
  int i;
  int deepest;
  DdNode *res;
  DdHashTable *table;
  DdNode **vector_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  do {
    dd->reordered = 0;
    table_00 = cuddHashTableInit(dd,1,2);
    if (table_00 == (DdHashTable *)0x0) {
      return (DdNode *)0x0;
    }
    local_3c = dd->size;
    do {
      local_3c = local_3c + -1;
      if (local_3c < 0) break;
    } while (vector[dd->invperm[local_3c]] == dd->vars[dd->invperm[local_3c]]);
    pDVar1 = cuddBddVectorComposeRecur(dd,table_00,f,vector,local_3c);
    if (pDVar1 != (DdNode *)0x0) {
      *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
    }
    cuddHashTableQuit(table_00);
    if (dd->reordered != 1) {
      if (pDVar1 != (DdNode *)0x0) {
        *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + -1;
      }
      return pDVar1;
    }
  } while( true );
}

Assistant:

DdNode *
Cudd_bddVectorCompose(
  DdManager * dd,
  DdNode * f,
  DdNode ** vector)
{
    DdHashTable         *table;
    DdNode              *res;
    int                 deepest;
    int                 i;

    do {
        dd->reordered = 0;
        /* Initialize local cache. */
        table = cuddHashTableInit(dd,1,2);
        if (table == NULL) return(NULL);

        /* Find deepest real substitution. */
        for (deepest = dd->size - 1; deepest >= 0; deepest--) {
            i = dd->invperm[deepest];
            if (vector[i] != dd->vars[i]) {
                break;
            }
        }

        /* Recursively solve the problem. */
        res = cuddBddVectorComposeRecur(dd,table,f,vector, deepest);
        if (res != NULL) cuddRef(res);

        /* Dispose of local cache. */
        cuddHashTableQuit(table);
    } while (dd->reordered == 1);

    if (res != NULL) cuddDeref(res);
    return(res);

}